

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[35],kj::Exception_const&,char>
          (String *__return_storage_ptr__,kj *this,char (*params) [35],Exception *params_1,
          char *params_2)

{
  undefined8 params_00;
  String local_51;
  ArrayPtr<const_char> local_38;
  
  local_38 = toCharSequence<char_const(&)[35]>((char (*) [35])this);
  params_00 = (long)&local_51.content.ptr + 1;
  operator*(params_00,params);
  local_51.content.ptr._0_1_ = *(undefined1 *)&(params_1->ownFile).content.ptr;
  _::concat<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_38,(ArrayPtr<const_char> *)params_00,&local_51,
             (FixedArray<char,_1UL> *)params_2);
  Array<char>::~Array((Array<char> *)((long)&local_51.content.ptr + 1));
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}